

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O1

optional<double> __thiscall
yactfr::internal::StrScanner::tryScanConstReal<true,false>(StrScanner *this)

{
  char *pcVar1;
  bool bVar2;
  int *piVar3;
  undefined8 uVar4;
  char *at;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  optional<double> oVar6;
  char *strEnd;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_38;
  
  do {
    pcVar1 = this->_at;
    if (pcVar1 == this->_end) break;
    _skipWhitespaces(this);
  } while (this->_at != pcVar1);
  local_38.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_begin = (char *)0x0;
  local_38.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (this->_at,this->_end,&local_38,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)_realRegex_abi_cxx11_,0
                    );
  dVar5 = extraout_XMM0_Qa;
  if (local_38.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    dVar5 = extraout_XMM0_Qa_00;
  }
  if (bVar2) {
    local_38.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dVar5 = strtod(this->_at,(char **)&local_38);
    if ((dVar5 < INFINITY) &&
       (((dVar5 != 0.0 || (NAN(dVar5))) ||
        ((pointer)this->_at !=
         local_38.
         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start)))) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x22) {
        this->_at = (char *)local_38.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = CONCAT71((int7)((ulong)local_38.
                                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 8),1);
        goto LAB_0021d976;
      }
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
  }
LAB_0021d976:
  oVar6.super_type.m_storage = dVar5;
  oVar6.super_type._0_8_ = uVar4;
  return (optional<double>)oVar6.super_type;
}

Assistant:

boost::optional<double> StrScanner::tryScanConstReal()
{
    this->skipCommentsAndWhitespaces<SkipWsV, SkipCommentsV>();

    /*
     * Validate JSON number format (with fraction and/or exponent part).
     *
     * This is needed because std::strtod() accepts more formats which
     * JSON doesn't support.
     */
    if (!std::regex_search(_at, _end, StrScanner::_realRegex)) {
        return boost::none;
    }

    // parse
    char *strEnd = nullptr;
    const auto val = std::strtod(_at, &strEnd);

    if (val == HUGE_VAL || (val == 0 && &(*_at) == strEnd) || errno == ERANGE) {
        // could not parse
        errno = 0;
        return boost::none;
    }

    // success: update position and return value
    _at += (strEnd - &(*_at));
    return val;
}